

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Core.c
# Opt level: O2

Abc_Cex_t * Llb_CoreDeriveCex(Llb_Img_t *p)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  char *string;
  Vec_Ptr_t *pVVar4;
  Abc_Cex_t *p_00;
  DdNode *pDVar5;
  DdNode *n;
  DdNode *n_00;
  Aig_Man_t *pAVar6;
  int iVar7;
  long lVar8;
  int i;
  int iVar9;
  bool bVar10;
  DdNode *local_50;
  Vec_Ptr_t *vQuant1;
  Vec_Ptr_t *vQuant0;
  
  iVar2 = Cudd_ReadSize(p->ddR);
  string = (char *)malloc((long)iVar2);
  if (p->vRings->nSize < 1) {
    __assert_fail("Vec_PtrSize(p->vRings) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb2Core.c"
                  ,0x6a,"Abc_Cex_t *Llb_CoreDeriveCex(Llb_Img_t *)");
  }
  p->dd->TimeStop = 0;
  p->ddR->TimeStop = 0;
  Vec_PtrReverseOrder(p->vDdMans);
  pVVar4 = Llb_ImgSupports(p->pAig,p->vDdMans,p->vVarsNs,p->vVarsCs,1,0);
  Llb_ImgSchedule(pVVar4,&vQuant0,&vQuant1,0);
  Vec_VecFree((Vec_Vec_t *)pVVar4);
  Llb_ImgQuantifyReset(p->vDdMans);
  p_00 = Abc_CexAlloc(p->pAig->nRegs,p->pAig->nTruePis,p->vRings->nSize);
  pVVar4 = p->vRings;
  iVar2 = pVVar4->nSize;
  p_00->iPo = -1;
  p_00->iFrame = iVar2 + -1;
  if ((long)iVar2 < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                  ,0x1b7,"void *Vec_PtrEntryLast(Vec_Ptr_t *)");
  }
  pDVar5 = Cudd_bddIntersect(p->ddR,(DdNode *)pVVar4->pArray[(long)iVar2 + -1],p->ddR->bFunc);
  Cudd_Ref(pDVar5);
  iVar2 = Cudd_bddPickOneCube(p->ddR,pDVar5,string);
  Cudd_RecursiveDeref(p->ddR,pDVar5);
  if (iVar2 == 0) {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb2Core.c"
                  ,0x80,"Abc_Cex_t *Llb_CoreDeriveCex(Llb_Img_t *)");
  }
  pAVar6 = p->pAig;
  iVar2 = pAVar6->nTruePis;
  iVar9 = (p->vRings->nSize + -1) * iVar2 + pAVar6->nRegs;
  for (lVar8 = 0; iVar7 = (int)lVar8, iVar7 < iVar2; lVar8 = lVar8 + 1) {
    Vec_PtrEntry(pAVar6->vCis,iVar7);
    pAVar6 = p->pAig;
    if (string[lVar8 + pAVar6->nRegs] == '\x01') {
      (&p_00[1].iPo)[iVar9 + iVar7 >> 5] =
           (&p_00[1].iPo)[iVar9 + iVar7 >> 5] | 1 << ((byte)(iVar9 + iVar7) & 0x1f);
    }
    iVar2 = pAVar6->nTruePis;
  }
  iVar2 = p->vRings->nSize;
  if (iVar2 < 2) {
    local_50 = (DdNode *)0x0;
  }
  else {
    local_50 = Llb_CoreComputeCube(p->dd,p->vVarsNs,1,string);
    Cudd_Ref(local_50);
    iVar2 = p->vRings->nSize;
  }
  do {
    do {
      if (iVar2 < 1) {
        iVar2 = p->pAig->nRegs;
LAB_00694722:
        if (iVar9 != iVar2) {
          __assert_fail("nPiOffset == Saig_ManRegNum(p->pAig)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb2Core.c"
                        ,0xb8,"Abc_Cex_t *Llb_CoreDeriveCex(Llb_Img_t *)");
        }
        iVar2 = Saig_ManFindFailedPoCex(p->pInit,p_00);
        if ((-1 < iVar2) && (iVar2 < p->pInit->nTruePos)) {
          p_00->iPo = iVar2;
          free(string);
          Vec_VecFree((Vec_Vec_t *)vQuant0);
          Vec_VecFree((Vec_Vec_t *)vQuant1);
          return p_00;
        }
        __assert_fail("RetValue >= 0 && RetValue < Saig_ManPoNum(p->pInit)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb2Core.c"
                      ,0xbb,"Abc_Cex_t *Llb_CoreDeriveCex(Llb_Img_t *)");
      }
      iVar7 = iVar2 + -1;
      pDVar5 = (DdNode *)Vec_PtrEntry(p->vRings,iVar7);
      bVar10 = iVar2 == p->vRings->nSize;
      iVar2 = iVar7;
    } while (bVar10);
    n = Llb_ImgComputeImage(p->pAig,p->vDdMans,p->dd,local_50,vQuant0,vQuant1,p->vDriRefs,
                            p->pPars->TimeTarget,1,0,0);
    if (n == (DdNode *)0x0) {
      __assert_fail("bImage != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb2Core.c"
                    ,0x95,"Abc_Cex_t *Llb_CoreDeriveCex(Llb_Img_t *)");
    }
    Cudd_Ref(n);
    Cudd_RecursiveDeref(p->dd,local_50);
    n_00 = Extra_TransferPermute(p->dd,p->ddR,n,p->vCs2Glo->pArray);
    Cudd_Ref(n_00);
    Cudd_RecursiveDeref(p->dd,n);
    pDVar5 = Cudd_bddIntersect(p->ddR,n_00,pDVar5);
    Cudd_Ref(pDVar5);
    Cudd_RecursiveDeref(p->ddR,n_00);
    iVar3 = Cudd_bddPickOneCube(p->ddR,pDVar5,string);
    Cudd_RecursiveDeref(p->ddR,pDVar5);
    if (iVar3 == 0) {
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb2Core.c"
                    ,0xa5,"Abc_Cex_t *Llb_CoreDeriveCex(Llb_Img_t *)");
    }
    pAVar6 = p->pAig;
    iVar3 = pAVar6->nTruePis;
    iVar9 = iVar9 - iVar3;
    for (lVar8 = 0; i = (int)lVar8, i < iVar3; lVar8 = lVar8 + 1) {
      Vec_PtrEntry(pAVar6->vCis,i);
      pAVar6 = p->pAig;
      if (string[lVar8 + pAVar6->nRegs] == '\x01') {
        (&p_00[1].iPo)[iVar9 + i >> 5] =
             (&p_00[1].iPo)[iVar9 + i >> 5] | 1 << ((byte)(iVar9 + i) & 0x1f);
      }
      iVar3 = pAVar6->nTruePis;
    }
    if (iVar7 == 0) {
      lVar8 = 0;
      while( true ) {
        pAVar6 = p->pAig;
        iVar2 = pAVar6->nRegs;
        if (iVar2 <= lVar8) break;
        Vec_PtrEntry(pAVar6->vCis,pAVar6->nTruePis + (int)lVar8);
        pcVar1 = string + lVar8;
        lVar8 = lVar8 + 1;
        if (*pcVar1 != '\0') {
          __assert_fail("pValues[i] == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb2Core.c"
                        ,0xb1,"Abc_Cex_t *Llb_CoreDeriveCex(Llb_Img_t *)");
        }
      }
      goto LAB_00694722;
    }
    local_50 = Llb_CoreComputeCube(p->dd,p->vVarsNs,1,string);
    Cudd_Ref(local_50);
  } while( true );
}

Assistant:

Abc_Cex_t * Llb_CoreDeriveCex( Llb_Img_t * p )
{
    Abc_Cex_t * pCex;
    Aig_Obj_t * pObj;
    Vec_Ptr_t * vSupps, * vQuant0, * vQuant1;
    DdNode * bState = NULL, * bImage, * bOneCube, * bTemp, * bRing;
    int i, v, RetValue, nPiOffset;
    char * pValues = ABC_ALLOC( char, Cudd_ReadSize(p->ddR) );
    assert( Vec_PtrSize(p->vRings) > 0 );

    p->dd->TimeStop  = 0;
    p->ddR->TimeStop = 0;

    // get supports and quantified variables
    Vec_PtrReverseOrder( p->vDdMans );
    vSupps = Llb_ImgSupports( p->pAig, p->vDdMans, p->vVarsNs, p->vVarsCs, 1, 0 );
    Llb_ImgSchedule( vSupps, &vQuant0, &vQuant1, 0 );
    Vec_VecFree( (Vec_Vec_t *)vSupps );
    Llb_ImgQuantifyReset( p->vDdMans );
//    Llb_ImgQuantifyFirst( p->pAig, p->vDdMans, vQuant0 );

    // allocate room for the counter-example
    pCex = Abc_CexAlloc( Saig_ManRegNum(p->pAig), Saig_ManPiNum(p->pAig), Vec_PtrSize(p->vRings) );
    pCex->iFrame = Vec_PtrSize(p->vRings) - 1;
    pCex->iPo = -1;

    // get the last cube
    bOneCube = Cudd_bddIntersect( p->ddR, (DdNode *)Vec_PtrEntryLast(p->vRings), p->ddR->bFunc );  Cudd_Ref( bOneCube );
    RetValue = Cudd_bddPickOneCube( p->ddR, bOneCube, pValues );
    Cudd_RecursiveDeref( p->ddR, bOneCube );
    assert( RetValue );

    // write PIs of counter-example
    nPiOffset = Saig_ManRegNum(p->pAig) + Saig_ManPiNum(p->pAig) * (Vec_PtrSize(p->vRings) - 1);
    Saig_ManForEachPi( p->pAig, pObj, i )
        if ( pValues[Saig_ManRegNum(p->pAig)+i] == 1 )
            Abc_InfoSetBit( pCex->pData, nPiOffset + i );

    // write state in terms of NS variables
    if ( Vec_PtrSize(p->vRings) > 1 )
    {
        bState = Llb_CoreComputeCube( p->dd, p->vVarsNs, 1, pValues );   Cudd_Ref( bState );
    }
    // perform backward analysis
    Vec_PtrForEachEntryReverse( DdNode *, p->vRings, bRing, v )
    { 
        if ( v == Vec_PtrSize(p->vRings) - 1 )
            continue;
        // compute the next states
        bImage = Llb_ImgComputeImage( p->pAig, p->vDdMans, p->dd, bState, 
            vQuant0, vQuant1, p->vDriRefs, p->pPars->TimeTarget, 1, 0, 0 );
        assert( bImage != NULL );
        Cudd_Ref( bImage );
        Cudd_RecursiveDeref( p->dd, bState );
//Extra_bddPrintSupport( p->dd, bImage ); printf( "\n" );

        // move reached states into ring manager
        bImage = Extra_TransferPermute( p->dd, p->ddR, bTemp = bImage, Vec_IntArray(p->vCs2Glo) );    Cudd_Ref( bImage );
        Cudd_RecursiveDeref( p->dd, bTemp );

        // intersect with the previous set
        bOneCube = Cudd_bddIntersect( p->ddR, bImage, bRing );                Cudd_Ref( bOneCube );
        Cudd_RecursiveDeref( p->ddR, bImage );

        // find any assignment of the BDD
        RetValue = Cudd_bddPickOneCube( p->ddR, bOneCube, pValues );
        Cudd_RecursiveDeref( p->ddR, bOneCube );
        assert( RetValue );

        // write PIs of counter-example
        nPiOffset -= Saig_ManPiNum(p->pAig);
        Saig_ManForEachPi( p->pAig, pObj, i )
            if ( pValues[Saig_ManRegNum(p->pAig)+i] == 1 )
                Abc_InfoSetBit( pCex->pData, nPiOffset + i );

        // check that we get the init state
        if ( v == 0 )
        {
            Saig_ManForEachLo( p->pAig, pObj, i )
                assert( pValues[i] == 0 );
            break;
        }

        // write state in terms of NS variables
        bState = Llb_CoreComputeCube( p->dd, p->vVarsNs, 1, pValues );   Cudd_Ref( bState );
    }
    assert( nPiOffset == Saig_ManRegNum(p->pAig) );
    // update the output number
    RetValue = Saig_ManFindFailedPoCex( p->pInit, pCex );
    assert( RetValue >= 0 && RetValue < Saig_ManPoNum(p->pInit) ); // invalid CEX!!!
    pCex->iPo = RetValue;
    // cleanup
    ABC_FREE( pValues );
    Vec_VecFree( (Vec_Vec_t *)vQuant0 );
    Vec_VecFree( (Vec_Vec_t *)vQuant1 );
    return pCex;
}